

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O3

void __thiscall arbiter::http::Curl::Curl(Curl *this,string *s)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  int iVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  undefined1 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var6;
  pointer pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long *plVar9;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar10;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar11;
  bool bVar12;
  CURL *pCVar13;
  size_type sVar14;
  const_reference pvVar15;
  int *piVar16;
  ostream *poVar17;
  undefined8 uVar18;
  const_iterator __end3;
  long lVar19;
  pointer pbVar20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  long ret;
  json c;
  Keys ProxyKeys;
  Keys caInfoKeys;
  Keys caPathKeys;
  Keys verifyKeys;
  Keys redirKeys;
  Keys timeoutKeys;
  Keys verboseKeys;
  long *local_2e8;
  json_value local_2e0;
  long local_2d8 [2];
  undefined1 local_2c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_228;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_220;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_218;
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  char local_1f0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  _Any_data local_138;
  code *local_128;
  undefined8 uStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->m_curl = (CURL *)0x0;
  this->m_headers = (curl_slist *)0x0;
  this->m_verbose = false;
  this->m_timeout = 5;
  this->m_followRedirect = true;
  this->m_verifyPeer = true;
  this_00 = &this->m_caPath;
  this_01 = &this->m_caInfo;
  local_228 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&this->m_proxy;
  (this->m_caPath)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->m_caInfo)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->m_proxy)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_220 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_01;
  local_218 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00;
  if (s->_M_string_length == 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_210,(initializer_list_t)ZEXT816(0),false,object);
  }
  else {
    first._M_current = (s->_M_dataplus)._M_p;
    nlohmann::detail::input_adapter::
    input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              ((input_adapter *)local_2c8,first,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(first._M_current + s->_M_string_length));
    local_128 = (code *)0x0;
    uStack_120 = 0;
    local_138._M_unused._M_object = (void *)0x0;
    local_138._8_8_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_210,(input_adapter *)local_2c8,(parser_callback_t *)&local_138,true);
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_);
    }
  }
  pCVar13 = (CURL *)curl_easy_init();
  this->m_curl = pCVar13;
  if (local_210[0] == null) goto LAB_0016dd08;
  pbVar1 = (pointer)(local_2c8 + 0x10);
  local_2c8._0_8_ = pbVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"verbose","");
  local_2e8 = (long *)((ulong)local_2e8 & 0xffffffffffffff00);
  bVar12 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::value<bool,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)local_210,(key_type *)local_2c8,(bool *)&local_2e8);
  this->m_verbose = bVar12;
  if ((pointer)local_2c8._0_8_ != pbVar1) {
    operator_delete((void *)local_2c8._0_8_);
  }
  local_2c8._0_8_ = pbVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"http","");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_200,(initializer_list_t)ZEXT816(0),false,object);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)&local_2e8,(key_type *)local_210,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_2c8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_200);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_200 + 8),local_200[0]);
  if ((pointer)local_2c8._0_8_ != pbVar1) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((value_t)local_2e8 != null) {
    sVar14 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::count<char_const(&)[8]>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_2e8,(char (*) [8])"timeout");
    if (sVar14 != 0) {
      pvVar15 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)&local_2e8,"timeout");
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_long,_0>
                (pvVar15,(long *)local_2c8);
      this->m_timeout = local_2c8._0_8_;
    }
    sVar14 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::count<char_const(&)[15]>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_2e8,(char (*) [15])"followRedirect");
    if (sVar14 != 0) {
      pvVar15 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)&local_2e8,"followRedirect");
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar15,(boolean_t *)local_2c8);
      this->m_followRedirect = (bool)local_2c8[0];
    }
    sVar14 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::count<char_const(&)[9]>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_2e8,(char (*) [9])"caBundle");
    if (sVar14 == 0) {
      sVar14 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::count<char_const(&)[7]>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&local_2e8,(char (*) [7])"caPath");
      if (sVar14 != 0) {
        pvVar15 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)&local_2e8,"caPath");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_70,pvVar15);
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
        uVar18 = local_2c8._0_8_;
        local_2c8._0_8_ = (element_type *)0x0;
        ::std::
        __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,(pointer)uVar18);
        uVar18 = local_2c8._0_8_;
        if ((element_type *)local_2c8._0_8_ != (element_type *)0x0) {
          if ((element_type *)*(_func_int ***)local_2c8._0_8_ !=
              (element_type *)(local_2c8._0_8_ + 0x10)) {
            operator_delete(*(_func_int ***)local_2c8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        pbVar8 = &local_70;
        goto LAB_0016db54;
      }
    }
    else {
      pvVar15 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)&local_2e8,"caBundle");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_50,pvVar15);
      internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                ((internal *)local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
      uVar18 = local_2c8._0_8_;
      local_2c8._0_8_ = (element_type *)0x0;
      ::std::
      __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,(pointer)uVar18);
      uVar18 = local_2c8._0_8_;
      if ((element_type *)local_2c8._0_8_ != (element_type *)0x0) {
        if ((element_type *)*(_func_int ***)local_2c8._0_8_ !=
            (element_type *)(local_2c8._0_8_ + 0x10)) {
          operator_delete(*(_func_int ***)local_2c8._0_8_);
        }
        operator_delete((void *)uVar18);
      }
      pbVar8 = &local_50;
LAB_0016db54:
      local_2c8._0_8_ = (pointer)0x0;
      puVar4 = *(undefined1 **)((pbVar8->field_2)._M_local_buf + -0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar4 != &pbVar8->field_2) {
        operator_delete(puVar4);
      }
    }
    sVar14 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::count<char_const(&)[7]>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_2e8,(char (*) [7])"caInfo");
    if (sVar14 != 0) {
      pvVar15 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)&local_2e8,"caInfo");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_90,pvVar15);
      internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                ((internal *)local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
      uVar18 = local_2c8._0_8_;
      local_2c8._0_8_ = (element_type *)0x0;
      ::std::
      __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01,(pointer)uVar18);
      uVar18 = local_2c8._0_8_;
      if ((element_type *)local_2c8._0_8_ != (element_type *)0x0) {
        if ((element_type *)*(_func_int ***)local_2c8._0_8_ !=
            (element_type *)(local_2c8._0_8_ + 0x10)) {
          operator_delete(*(_func_int ***)local_2c8._0_8_);
        }
        operator_delete((void *)uVar18);
      }
      local_2c8._0_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
    sVar14 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::count<char_const(&)[6]>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_2e8,(char (*) [6])"Proxy");
    if (sVar14 != 0) {
      pvVar15 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)&local_2e8,"Proxy");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_b0,pvVar15);
      internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                ((internal *)local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
      uVar18 = local_2c8._0_8_;
      local_2c8._0_8_ = (element_type *)0x0;
      ::std::
      __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228,(pointer)uVar18);
      uVar18 = local_2c8._0_8_;
      if ((element_type *)local_2c8._0_8_ != (element_type *)0x0) {
        if ((element_type *)*(_func_int ***)local_2c8._0_8_ !=
            (element_type *)(local_2c8._0_8_ + 0x10)) {
          operator_delete(*(_func_int ***)local_2c8._0_8_);
        }
        operator_delete((void *)uVar18);
      }
      local_2c8._0_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    sVar14 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::count<char_const(&)[11]>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_2e8,(char (*) [11])"verifyPeer");
    if (sVar14 != 0) {
      pvVar15 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)&local_2e8,"verifyPeer");
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar15,(boolean_t *)local_2c8);
      this->m_verifyPeer = (bool)local_2c8[0];
    }
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&local_2e8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_2e0.boolean,(value_t)local_2e8);
LAB_0016dd08:
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2c8 + 0x10);
  local_2c8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"VERBOSE","");
  local_2a8._M_allocated_capacity = (size_type)local_298;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"CURL_VERBOSE","");
  local_288[0] = local_278;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"ARBITER_VERBOSE","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_2c8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,__l,(allocator_type *)&local_2e8);
  lVar19 = 0;
  do {
    if (local_278 + lVar19 != *(undefined1 **)((long)local_288 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_288 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x60);
  local_2c8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"CURL_TIMEOUT","");
  local_2a8._M_allocated_capacity = (size_type)local_298;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"ARBITER_HTTP_TIMEOUT","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_2c8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_168,__l_00,(allocator_type *)&local_2e8);
  lVar19 = 0;
  do {
    if (local_298 + lVar19 != *(undefined1 **)((long)&local_2a8 + lVar19)) {
      operator_delete(*(undefined1 **)((long)&local_2a8 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x40);
  local_2c8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"CURL_FOLLOWLOCATION","");
  local_2a8._M_allocated_capacity = (size_type)local_298;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"CURL_FOLLOW_LOCATION","");
  local_288[0] = local_278;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,"ARBITER_FOLLOW_LOCATIONARBITER_FOLLOW_REDIRECT","");
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_2c8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_180,__l_01,(allocator_type *)&local_2e8);
  lVar19 = 0;
  do {
    if (local_278 + lVar19 != *(undefined1 **)((long)local_288 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_288 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x60);
  local_2c8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"CURL_SSL_VERIFYPEER","");
  local_2a8._M_allocated_capacity = (size_type)local_298;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"CURL_VERIFY_PEER","");
  local_288[0] = local_278;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"ARBITER_VERIFY_PEER","");
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)local_2c8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_198,__l_02,(allocator_type *)&local_2e8);
  lVar19 = 0;
  do {
    if (local_278 + lVar19 != *(undefined1 **)((long)local_288 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_288 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x60);
  local_2c8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"CURL_CA_PATH","");
  local_2a8._M_allocated_capacity = (size_type)local_298;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"CURL_CA_BUNDLE","");
  local_288[0] = local_278;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"ARBITER_CA_PATH","");
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_2c8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,__l_03,(allocator_type *)&local_2e8);
  lVar19 = 0;
  do {
    if (local_278 + lVar19 != *(undefined1 **)((long)local_288 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_288 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x60);
  local_2c8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"CURL_CAINFO","");
  local_2a8._M_allocated_capacity = (size_type)local_298;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"CURL_CA_INFO","");
  local_288[0] = local_278;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"ARBITER_CA_INFO","");
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)local_2c8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c8,__l_04,(allocator_type *)&local_2e8);
  lVar19 = 0;
  do {
    if (local_278 + lVar19 != *(undefined1 **)((long)local_288 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_288 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x60);
  local_2c8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"CURL_PROXY","");
  local_2a8._M_allocated_capacity = (size_type)local_298;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"HTTP_PROXY","");
  local_288[0] = local_278;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"HTTPS_PROXY","");
  local_268[0] = local_258;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"ALL_PROXY","");
  local_248[0] = local_238;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"ARBITER_PROXY","");
  __l_05._M_len = 5;
  __l_05._M_array = (iterator)local_2c8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e0,__l_05,(allocator_type *)&local_2e8);
  lVar19 = 0;
  do {
    if (local_238 + lVar19 != *(undefined1 **)((long)local_248 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_248 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0xa0);
  if (local_150.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_150.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar20 = local_150.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2c8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2c8._0_8_);
        uVar18 = local_2c8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2c8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2c8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (local_2e8 != (long *)0x0) {
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_2e8;
          piVar16 = __errno_location();
          iVar3 = *piVar16;
          *piVar16 = 0;
          lVar19 = strtol((char *)pbVar5,(char **)local_2c8,10);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_
              == pbVar5) {
            ::std::__throw_invalid_argument("stol");
            goto LAB_0016ec28;
          }
          if (*piVar16 == 0) {
LAB_0016e274:
            *piVar16 = iVar3;
          }
          else if (*piVar16 == 0x22) {
            lVar19 = ::std::__throw_out_of_range("stol");
            goto LAB_0016e274;
          }
          plVar9 = local_2e8;
          this->m_verbose = lVar19 != 0;
          if (local_2e8 != (long *)0x0) {
            if ((long *)*local_2e8 != local_2e8 + 2) {
              operator_delete((long *)*local_2e8);
            }
            operator_delete(plVar9);
          }
        }
        break;
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             local_150.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar20 = local_168.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2c8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2c8._0_8_);
        uVar18 = local_2c8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2c8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2c8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (local_2e8 != (long *)0x0) {
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_2e8;
          piVar16 = __errno_location();
          iVar3 = *piVar16;
          *piVar16 = 0;
          lVar19 = strtol((char *)pbVar5,(char **)local_2c8,10);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_
              == pbVar5) goto LAB_0016ec28;
          if (*piVar16 == 0) {
LAB_0016e369:
            *piVar16 = iVar3;
          }
          else if (*piVar16 == 0x22) {
            lVar19 = ::std::__throw_out_of_range("stol");
            goto LAB_0016e369;
          }
          plVar9 = local_2e8;
          this->m_timeout = lVar19;
          if (local_2e8 != (long *)0x0) {
            if ((long *)*local_2e8 != local_2e8 + 2) {
              operator_delete((long *)*local_2e8);
            }
            operator_delete(plVar9);
          }
        }
        break;
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             local_168.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_180.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_180.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar20 = local_180.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2c8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2c8._0_8_);
        uVar18 = local_2c8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2c8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2c8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (local_2e8 != (long *)0x0) {
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_2e8;
          piVar16 = __errno_location();
          iVar3 = *piVar16;
          *piVar16 = 0;
          lVar19 = strtol((char *)pbVar5,(char **)local_2c8,10);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_
              == pbVar5) goto LAB_0016ec34;
          if (*piVar16 == 0) {
LAB_0016e45a:
            *piVar16 = iVar3;
          }
          else if (*piVar16 == 0x22) {
            lVar19 = ::std::__throw_out_of_range("stol");
            goto LAB_0016e45a;
          }
          plVar9 = local_2e8;
          this->m_followRedirect = lVar19 != 0;
          if (local_2e8 != (long *)0x0) {
            if ((long *)*local_2e8 != local_2e8 + 2) {
              operator_delete((long *)*local_2e8);
            }
            operator_delete(plVar9);
          }
        }
        break;
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             local_180.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar20 = local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2c8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2c8._0_8_);
        uVar18 = local_2c8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2c8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2c8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (local_2e8 != (long *)0x0) {
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_2e8;
          piVar16 = __errno_location();
          iVar3 = *piVar16;
          *piVar16 = 0;
          lVar19 = strtol((char *)pbVar5,(char **)local_2c8,10);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_
              == pbVar5) goto LAB_0016ec40;
          if (*piVar16 == 0) {
LAB_0016e54f:
            *piVar16 = iVar3;
          }
          else if (*piVar16 == 0x22) {
            lVar19 = ::std::__throw_out_of_range("stol");
            goto LAB_0016e54f;
          }
          plVar9 = local_2e8;
          this->m_verifyPeer = lVar19 != 0;
          if (local_2e8 != (long *)0x0) {
            if ((long *)*local_2e8 != local_2e8 + 2) {
              operator_delete((long *)*local_2e8);
            }
            operator_delete(plVar9);
          }
        }
        break;
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             local_198.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar20 = local_1b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2c8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2c8._0_8_);
        uVar18 = local_2c8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2c8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2c8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (local_2e8 != (long *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,*local_2e8,local_2e8[1] + *local_2e8);
          internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                    ((internal *)local_2c8,&local_d0);
          uVar18 = local_2c8._0_8_;
          local_2c8._0_8_ = (element_type *)0x0;
          ::std::
          __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_218,(pointer)uVar18);
          uVar18 = local_2c8._0_8_;
          if ((element_type *)local_2c8._0_8_ != (element_type *)0x0) {
            if ((element_type *)*(_func_int ***)local_2c8._0_8_ !=
                (element_type *)(local_2c8._0_8_ + 0x10)) {
              operator_delete(*(_func_int ***)local_2c8._0_8_);
            }
            operator_delete((void *)uVar18);
          }
          local_2c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          plVar9 = local_2e8;
          if (local_2e8 != (long *)0x0) {
            if ((long *)*local_2e8 != local_2e8 + 2) {
              operator_delete((long *)*local_2e8);
            }
            operator_delete(plVar9);
          }
        }
        break;
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar20 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2c8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2c8._0_8_);
        uVar18 = local_2c8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2c8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2c8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (local_2e8 != (long *)0x0) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,*local_2e8,local_2e8[1] + *local_2e8);
          internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                    ((internal *)local_2c8,&local_f0);
          uVar18 = local_2c8._0_8_;
          local_2c8._0_8_ = (element_type *)0x0;
          ::std::
          __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_220,(pointer)uVar18);
          uVar18 = local_2c8._0_8_;
          if ((element_type *)local_2c8._0_8_ != (element_type *)0x0) {
            if ((element_type *)*(_func_int ***)local_2c8._0_8_ !=
                (element_type *)(local_2c8._0_8_ + 0x10)) {
              operator_delete(*(_func_int ***)local_2c8._0_8_);
            }
            operator_delete((void *)uVar18);
          }
          local_2c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          plVar9 = local_2e8;
          if (local_2e8 != (long *)0x0) {
            if ((long *)*local_2e8 != local_2e8 + 2) {
              operator_delete((long *)*local_2e8);
            }
            operator_delete(plVar9);
          }
        }
        break;
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             local_1c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar20 = local_1e0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2c8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2c8._0_8_);
        uVar18 = local_2c8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2c8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2c8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (local_2e8 != (long *)0x0) {
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,*local_2e8,local_2e8[1] + *local_2e8);
          internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                    ((internal *)local_2c8,&local_110);
          uVar18 = local_2c8._0_8_;
          local_2c8._0_8_ = (element_type *)0x0;
          ::std::
          __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_228,(pointer)uVar18);
          uVar18 = local_2c8._0_8_;
          if ((element_type *)local_2c8._0_8_ != (element_type *)0x0) {
            if ((element_type *)*(_func_int ***)local_2c8._0_8_ !=
                (element_type *)(local_2c8._0_8_ + 0x10)) {
              operator_delete(*(_func_int ***)local_2c8._0_8_);
            }
            operator_delete((void *)uVar18);
          }
          local_2c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          plVar9 = local_2e8;
          if (local_2e8 != (long *)0x0) {
            if ((long *)*local_2e8 != local_2e8 + 2) {
              operator_delete((long *)*local_2e8);
            }
            operator_delete(plVar9);
          }
        }
        break;
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             local_1e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((this->m_verbose == true) && (Curl(std::__cxx11::string)::logged == '\0')) {
    Curl(std::__cxx11::string)::logged = '\x01';
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"Curl config:",0xc)
    ;
    *(uint *)(curl_easy_init + *(long *)(::std::cout + -0x18)) =
         *(uint *)(curl_easy_init + *(long *)(::std::cout + -0x18)) | 1;
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&::std::cout,"\n\ttimeout: ",0xb);
    poVar17 = ::std::ostream::_M_insert<long>((long)&::std::cout);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"s",1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\tfollowRedirect: ",0x12);
    poVar17 = ::std::ostream::_M_insert<bool>(SUB81(poVar17,0));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\tverifyPeer: ",0xe);
    poVar17 = ::std::ostream::_M_insert<bool>(SUB81(poVar17,0));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\tcaBundle: ",0xc);
    _Var6._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_218;
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var6._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      local_2c8._0_8_ = pbVar2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"(default)","");
    }
    else {
      local_2c8._0_8_ = pbVar2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c8,
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,
                 *(long *)((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 8) +
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    }
    poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,(char *)local_2c8._0_8_,local_2c8._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\tcaInfo: ",10);
    _Var6._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_220;
    local_2e8 = local_2d8;
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var6._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"(default)","");
    }
    else {
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e8,
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,
                 *(long *)((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 8) +
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    }
    poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,(char *)local_2e8,local_2e0.number_integer);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\tProxy: ",9);
    _Var6._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_228;
    local_200._0_8_ = local_1f0;
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var6._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"(default)","");
    }
    else {
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_200,
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,
                 *(long *)((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 8) +
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    }
    poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,(char *)local_200._0_8_,local_200._8_8_);
    ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    ::std::ostream::put((char)poVar17);
    ::std::ostream::flush();
    if ((char *)local_200._0_8_ != local_1f0) {
      operator_delete((void *)local_200._0_8_);
    }
    if (local_2e8 != local_2d8) {
      operator_delete(local_2e8);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8._0_8_ !=
        pbVar2) {
      operator_delete((void *)local_2c8._0_8_);
    }
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_210);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_210 + 8),local_210[0]);
  return;
LAB_0016ec28:
  ::std::__throw_invalid_argument("stol");
LAB_0016ec34:
  ::std::__throw_invalid_argument("stol");
LAB_0016ec40:
  uVar18 = ::std::__throw_invalid_argument("stol");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&local_2e8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_210);
  pcVar7 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar7 != (pointer)0x0) {
    operator_delete(pcVar7);
  }
  pdVar10 = local_228;
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_228 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(local_228,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_228);
  }
  pdVar11 = local_220;
  *(undefined8 *)pdVar10 = 0;
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_220 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(local_220,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_220);
  }
  pdVar10 = local_218;
  *(undefined8 *)pdVar11 = 0;
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_218 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(local_218,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_218);
  }
  *(undefined8 *)pdVar10 = 0;
  _Unwind_Resume(uVar18);
}

Assistant:

Curl::Curl(const std::string s)
{
#ifdef ARBITER_CURL
    const json c(s.size() ? json::parse(s) : json::object());

    m_curl = curl_easy_init();

    // Configurable entries are:
    //      - timeout           (CURLOPT_LOW_SPEED_TIME)
    //      - followRedirect    (CURLOPT_FOLLOWLOCATION)
    //      - caBundle          (CURLOPT_CAPATH)
    //      - caInfo            (CURLOPT_CAINFO)
    //      - verifyPeer        (CURLOPT_SSL_VERIFYPEER)
    //      - proxy             (CURLOPT_PROXY)

    using Keys = std::vector<std::string>;
    auto find([](const Keys& keys)->std::unique_ptr<std::string>
    {
        for (const auto& key : keys)
        {
            if (auto e = env(key)) return makeUnique<std::string>(*e);
        }
        return std::unique_ptr<std::string>();
    });

    auto mk([](std::string s) { return makeUnique<std::string>(s); });

    if (!c.is_null())
    {
        m_verbose = c.value("verbose", false);
        const auto& h(c.value("http", json::object()));

        if (!h.is_null())
        {
            if (h.count("timeout"))
            {
                m_timeout = h["timeout"].get<long>();
            }

            if (h.count("followRedirect"))
            {
                m_followRedirect = h["followRedirect"].get<bool>();
            }

            if (h.count("caBundle"))
            {
                m_caPath = mk(h["caBundle"].get<std::string>());
            }
            else if (h.count("caPath"))
            {
                m_caPath = mk(h["caPath"].get<std::string>());
            }

            if (h.count("caInfo"))
            {
                m_caInfo = mk(h["caInfo"].get<std::string>());
            }

            if (h.count("Proxy"))
            {
                m_proxy = mk(h["Proxy"].get<std::string>());
            }

            if (h.count("verifyPeer"))
            {
                m_verifyPeer = h["verifyPeer"].get<bool>();
            }
        }
    }

    Keys verboseKeys{ "VERBOSE", "CURL_VERBOSE", "ARBITER_VERBOSE" };
    Keys timeoutKeys{ "CURL_TIMEOUT", "ARBITER_HTTP_TIMEOUT" };
    Keys redirKeys{
        "CURL_FOLLOWLOCATION",
        "CURL_FOLLOW_LOCATION",
        "ARBITER_FOLLOW_LOCATION"
        "ARBITER_FOLLOW_REDIRECT"
    };
    Keys verifyKeys{
        "CURL_SSL_VERIFYPEER",
        "CURL_VERIFY_PEER",
        "ARBITER_VERIFY_PEER"
    };
    Keys caPathKeys{ "CURL_CA_PATH", "CURL_CA_BUNDLE", "ARBITER_CA_PATH" };
    Keys caInfoKeys{ "CURL_CAINFO", "CURL_CA_INFO", "ARBITER_CA_INFO" };
    Keys ProxyKeys{ "CURL_PROXY", "HTTP_PROXY", "HTTPS_PROXY", "ALL_PROXY", "ARBITER_PROXY"};

    if (auto v = find(verboseKeys)) m_verbose = !!std::stol(*v);
    if (auto v = find(timeoutKeys)) m_timeout = std::stol(*v);
    if (auto v = find(redirKeys)) m_followRedirect = !!std::stol(*v);
    if (auto v = find(verifyKeys)) m_verifyPeer = !!std::stol(*v);
    if (auto v = find(caPathKeys)) m_caPath = mk(*v);
    if (auto v = find(caInfoKeys)) m_caInfo = mk(*v);
    if (auto v = find(ProxyKeys)) m_proxy = mk(*v);

    static bool logged(false);
    if (m_verbose && !logged)
    {
        logged = true;
        std::cout << "Curl config:" << std::boolalpha <<
            "\n\ttimeout: " << m_timeout << "s" <<
            "\n\tfollowRedirect: " << m_followRedirect <<
            "\n\tverifyPeer: " << m_verifyPeer <<
            "\n\tcaBundle: " << (m_caPath ? *m_caPath : "(default)") <<
            "\n\tcaInfo: " << (m_caInfo ? *m_caInfo : "(default)") <<
            "\n\tProxy: " << (m_proxy ? *m_proxy : "(default)") <<
            std::endl;
    }
#endif
}